

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O2

bool __thiscall
cmGlobVerificationManager::CacheEntryKey::operator<(CacheEntryKey *this,CacheEntryKey *r)

{
  bool bVar1;
  
  bVar1 = true;
  if (r->Recurse <= this->Recurse) {
    if (this->Recurse <= r->Recurse) {
      if (this->ListDirectories < r->ListDirectories) {
        return true;
      }
      if (this->ListDirectories <= r->ListDirectories) {
        if (this->FollowSymlinks < r->FollowSymlinks) {
          return true;
        }
        if (this->FollowSymlinks <= r->FollowSymlinks) {
          bVar1 = std::operator<(&this->Relative,&r->Relative);
          if (bVar1) {
            return true;
          }
          bVar1 = std::operator>(&this->Relative,&r->Relative);
          if (!bVar1) {
            bVar1 = std::operator<(&this->Expression,&r->Expression);
            if (bVar1) {
              return true;
            }
            std::operator>(&this->Expression,&r->Expression);
          }
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGlobVerificationManager::CacheEntryKey::operator<(
  const CacheEntryKey& r) const
{
  if (this->Recurse < r.Recurse) {
    return true;
  }
  if (this->Recurse > r.Recurse) {
    return false;
  }
  if (this->ListDirectories < r.ListDirectories) {
    return true;
  }
  if (this->ListDirectories > r.ListDirectories) {
    return false;
  }
  if (this->FollowSymlinks < r.FollowSymlinks) {
    return true;
  }
  if (this->FollowSymlinks > r.FollowSymlinks) {
    return false;
  }
  if (this->Relative < r.Relative) {
    return true;
  }
  if (this->Relative > r.Relative) {
    return false;
  }
  if (this->Expression < r.Expression) {
    return true;
  }
  if (this->Expression > r.Expression) {
    return false;
  }
  return false;
}